

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O0

void initialize_iterative_algorithm_parameters
               (Iterative_Method_parameters *parameters,int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  Iterative_Method_parameters *parameters_local;
  
  parameters->implementation = Implementation_Native;
  parameters->preconditioner_type = Precond_Jacobi;
  parameters->method = Iterative_method_BiCGSTAB;
  parameters->relaxation_constant = 1.55;
  parameters->accuracy = 1e-08;
  if ((1 < argc) && (iVar1 = strncasecmp(argv[1],"Null",4), iVar1 == 0)) {
    parameters->preconditioner_type = Precond_Null;
  }
  if (2 < argc) {
    parameters->implementation = Implementation_Laspack;
    iVar1 = strncasecmp(argv[1],"Jacobi",6);
    if (iVar1 == 0) {
      parameters->preconditioner_type_laspack = JacobiPrecond;
    }
    else {
      iVar1 = strncasecmp(argv[1],"SSOR",4);
      if (iVar1 == 0) {
        parameters->preconditioner_type_laspack = SSORPrecond;
      }
      else {
        iVar1 = strncasecmp(argv[1],"NULL",4);
        if (iVar1 == 0) {
          parameters->preconditioner_type_laspack = (PrecondProcType)0x0;
        }
        else {
          parameters->preconditioner_type_laspack = (PrecondProcType)0x0;
        }
      }
    }
    iVar1 = strncasecmp(argv[2],"CGN",3);
    if (iVar1 == 0) {
      parameters->method_laspack = CGNIter;
    }
    else {
      iVar1 = strncasecmp(argv[2],"BiCGStab",8);
      if (iVar1 == 0) {
        parameters->method_laspack = BiCGSTABIter;
      }
      else {
        iVar1 = strncasecmp(argv[2],"CGS",3);
        if (iVar1 == 0) {
          parameters->method_laspack = CGSIter;
        }
        else {
          iVar1 = strncasecmp(argv[2],"QMR",3);
          if (iVar1 == 0) {
            parameters->method_laspack = QMRIter;
          }
          else {
            iVar1 = strncasecmp(argv[2],"GMRES",5);
            if (iVar1 == 0) {
              parameters->method_laspack = GMRESIter;
            }
            else {
              parameters->method_laspack = CGNIter;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void initialize_iterative_algorithm_parameters (Iterative_Method_parameters * parameters, int argc, char ** argv) {

  parameters->implementation = Implementation_Native;
  parameters->preconditioner_type = Precond_Jacobi;
  parameters->method = Iterative_method_BiCGSTAB;
  parameters->relaxation_constant = 1.55;
  parameters->accuracy = 1e-8;

  if (argc > 1) {
    if (strncasecmp (argv[1], "Null", 4) == 0) {
      parameters->preconditioner_type = Precond_Null;
    }
  }

#ifndef NO_LASPACK
  if (argc > 2) {
    parameters->implementation = Implementation_Laspack;
    if (strncasecmp (argv[1], "Jacobi", 6) == 0) {
      parameters->preconditioner_type_laspack = JacobiPrecond;
    } else if (strncasecmp (argv[1], "SSOR", 4) == 0) {
      parameters->preconditioner_type_laspack = SSORPrecond;
    } else if (strncasecmp (argv[1], "NULL", 4) == 0) {
      parameters->preconditioner_type_laspack = NULL;
    } else {
      // default value
      parameters->preconditioner_type_laspack = NULL;
    }

    if (strncasecmp (argv[2], "CGN", 3) == 0) {
      parameters->method_laspack = CGNIter;
    } else if (strncasecmp (argv[2], "BiCGStab", 8) == 0) {
      parameters->method_laspack = BiCGSTABIter;
    } else if (strncasecmp (argv[2], "CGS", 3) == 0) {
      parameters->method_laspack = CGSIter;
    } else if (strncasecmp (argv[2], "QMR", 3) == 0) {
      parameters->method_laspack = QMRIter;
    } else if (strncasecmp (argv[2], "GMRES", 5) == 0) {
      parameters->method_laspack = GMRESIter;
    } else {
      // default value
      parameters->method_laspack = CGNIter;
    }
  }
#else
  (void) argc;
  (void) argv;
#endif /* NO_LASPACK */
}